

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

bool absl::(anonymous_namespace)::Base64UnescapeInternal<std::__cxx11::string>
               (Nullable<const_char_*> src,size_t slen,
               Nonnull<std::__cxx11::basic_string<char>_*> dest,
               Nonnull<const_signed_char_*> unbase64)

{
  bool bVar1;
  ulong in_RDX;
  ulong in_RSI;
  Nonnull<size_t_*> in_RDI;
  size_t unaff_retaddr;
  Nullable<char_*> in_stack_00000008;
  size_t in_stack_00000010;
  Nullable<const_char_*> in_stack_00000018;
  bool ok;
  size_t len;
  size_t dest_len;
  size_t in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  ulong local_38;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::operator[](in_RDX);
  bVar1 = anon_unknown_0::Base64UnescapeInternal
                    (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                     (Nonnull<const_signed_char_*>)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
  if (bVar1) {
    if ((in_RSI >> 2) * 3 + (in_RSI & 3) < local_38) {
      __assert_fail("len <= dest_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/escaping.cc"
                    ,0x341,
                    "bool absl::(anonymous namespace)::Base64UnescapeInternal(absl::Nullable<const char *>, size_t, absl::Nonnull<String *>, absl::Nonnull<const signed char *>) [String = std::basic_string<char>]"
                   );
    }
    std::__cxx11::string::erase(in_RDX,local_38);
    bVar1 = true;
  }
  else {
    std::__cxx11::string::clear();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Base64UnescapeInternal(absl::Nullable<const char*> src, size_t slen,
                            absl::Nonnull<String*> dest,
                            absl::Nonnull<const signed char*> unbase64) {
  // Determine the size of the output string.  Base64 encodes every 3 bytes into
  // 4 characters.  Any leftover chars are added directly for good measure.
  const size_t dest_len = 3 * (slen / 4) + (slen % 4);

  strings_internal::STLStringResizeUninitialized(dest, dest_len);

  // We are getting the destination buffer by getting the beginning of the
  // string and converting it into a char *.
  size_t len;
  const bool ok =
      Base64UnescapeInternal(src, slen, &(*dest)[0], dest_len, unbase64, &len);
  if (!ok) {
    dest->clear();
    return false;
  }

  // could be shorter if there was padding
  assert(len <= dest_len);
  dest->erase(len);

  return true;
}